

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shader.cpp
# Opt level: O0

void __thiscall
piksel::Shader::load(Shader *this,string *vertexShaderFilename,string *fragmentShaderFilename)

{
  piksel local_60 [32];
  piksel local_40 [32];
  string *local_20;
  string *fragmentShaderFilename_local;
  string *vertexShaderFilename_local;
  Shader *this_local;
  
  local_20 = fragmentShaderFilename;
  fragmentShaderFilename_local = vertexShaderFilename;
  vertexShaderFilename_local = (string *)this;
  readFile(local_40,vertexShaderFilename);
  readFile(local_60,local_20);
  create(this,(string *)local_40,(string *)local_60);
  std::__cxx11::string::~string((string *)local_60);
  std::__cxx11::string::~string((string *)local_40);
  return;
}

Assistant:

void Shader::load(const std::string &vertexShaderFilename, const std::string &fragmentShaderFilename) {
    create(readFile(vertexShaderFilename), readFile(fragmentShaderFilename));
}